

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_inv_txfm2d.c
# Opt level: O0

void av1_inv_txfm2d_add_64x64_c(int32_t *input,uint16_t *output,int stride,TX_TYPE tx_type,int bd)

{
  long in_RDI;
  int txfm_buf [4224];
  int col;
  int32_t mod_input [4096];
  TX_SIZE in_stack_ffffffffffff7dee;
  TX_TYPE in_stack_ffffffffffff7def;
  int32_t *in_stack_ffffffffffff7df0;
  int in_stack_ffffffffffff7dfc;
  uint16_t *in_stack_ffffffffffff7e00;
  int32_t *in_stack_ffffffffffff7e08;
  int in_stack_ffffffffffff7e18;
  int local_4054;
  undefined1 local_4050 [128];
  undefined1 auStack_3fd0 [8064];
  undefined1 auStack_2050 [8216];
  long local_38;
  
  local_38 = in_RDI;
  for (local_4054 = 0; local_4054 < 0x20; local_4054 = local_4054 + 1) {
    memcpy(local_4050 + (long)(local_4054 << 6) * 4,(void *)(local_38 + (long)(local_4054 << 5) * 4)
           ,0x80);
    memset(auStack_3fd0 + (long)(local_4054 << 6) * 4,0,0x80);
  }
  memset(auStack_2050,0,0x2000);
  inv_txfm2d_add_facade
            (in_stack_ffffffffffff7e08,in_stack_ffffffffffff7e00,in_stack_ffffffffffff7dfc,
             in_stack_ffffffffffff7df0,in_stack_ffffffffffff7def,in_stack_ffffffffffff7dee,
             in_stack_ffffffffffff7e18);
  return;
}

Assistant:

void av1_inv_txfm2d_add_64x64_c(const int32_t *input, uint16_t *output,
                                int stride, TX_TYPE tx_type, int bd) {
  // TODO(urvang): Can the same array be reused, instead of using a new array?
  // Remap 32x32 input into a modified 64x64 by:
  // - Copying over these values in top-left 32x32 locations.
  // - Setting the rest of the locations to 0.
  int32_t mod_input[64 * 64];
  for (int col = 0; col < 32; ++col) {
    memcpy(mod_input + col * 64, input + col * 32, 32 * sizeof(*mod_input));
    memset(mod_input + col * 64 + 32, 0, 32 * sizeof(*mod_input));
  }
  memset(mod_input + 32 * 64, 0, 32 * 64 * sizeof(*mod_input));
  DECLARE_ALIGNED(32, int, txfm_buf[64 * 64 + 64 + 64]);
  inv_txfm2d_add_facade(mod_input, output, stride, txfm_buf, tx_type, TX_64X64,
                        bd);
}